

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOSXBundleGenerator.cxx
# Opt level: O0

void __thiscall
cmOSXBundleGenerator::GenerateMacOSXContentStatements
          (cmOSXBundleGenerator *this,
          vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *sources,
          MacOSXContentGeneratorType *generator,string *config)

{
  cmSourceFile *sf;
  bool bVar1;
  reference ppcVar2;
  SourceFileFlags SVar3;
  SourceFileFlags tsFlags;
  cmSourceFile *source;
  const_iterator __end1;
  const_iterator __begin1;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *__range1;
  string *config_local;
  MacOSXContentGeneratorType *generator_local;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *sources_local;
  cmOSXBundleGenerator *this_local;
  
  bVar1 = MustSkip(this);
  if (!bVar1) {
    __end1 = std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::begin
                       (sources);
    source = (cmSourceFile *)
             std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::end(sources);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<const_cmSourceFile_*const_*,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
                                       *)&source), bVar1) {
      ppcVar2 = __gnu_cxx::
                __normal_iterator<const_cmSourceFile_*const_*,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
                ::operator*(&__end1);
      sf = *ppcVar2;
      SVar3 = cmGeneratorTarget::GetTargetSourceFileFlags(this->GT,sf);
      if (SVar3.Type != SourceFileTypeNormal) {
        (*generator->_vptr_MacOSXContentGeneratorType[2])(generator,sf,SVar3.MacFolder,config);
      }
      __gnu_cxx::
      __normal_iterator<const_cmSourceFile_*const_*,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
      ::operator++(&__end1);
    }
  }
  return;
}

Assistant:

void cmOSXBundleGenerator::GenerateMacOSXContentStatements(
  std::vector<cmSourceFile const*> const& sources,
  MacOSXContentGeneratorType* generator, const std::string& config)
{
  if (this->MustSkip()) {
    return;
  }

  for (cmSourceFile const* source : sources) {
    cmGeneratorTarget::SourceFileFlags tsFlags =
      this->GT->GetTargetSourceFileFlags(source);
    if (tsFlags.Type != cmGeneratorTarget::SourceFileTypeNormal) {
      (*generator)(*source, tsFlags.MacFolder, config);
    }
  }
}